

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test::
TestBody(BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test *this)

{
  undefined8 *puVar1;
  _func_void__Any_data_ptr_void_ptr_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substring;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  undefined8 uVar2;
  pointer *__ptr;
  char *pcVar3;
  AssertionResult AVar4;
  _Any_data __tmp;
  AssertionResult gtest_ar_1;
  Response metrics;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [16];
  _Any_data local_b8;
  AssertHelper local_a8 [2];
  undefined1 local_98 [16];
  Response local_88;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  uStack_d0 = 0;
  uStack_cc = 0;
  local_88.code =
       *(long *)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
                 super__Function_base._M_functor;
  local_88.body._M_dataplus._M_p =
       *(pointer *)
        ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
                super__Function_base._M_functor + 8);
  *(BasicAuthIntegrationTest_shouldPerformProperAuthentication_Test **)
   &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
    super__Function_base._M_functor = this;
  *(undefined4 *)
   ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
           super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)
   ((long)&(this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
           super__Function_base._M_functor + 0xc) = 0;
  local_88.body._M_string_length =
       (size_type)
       (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.
       super__Function_base._M_manager;
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_.super__Function_base
  ._M_manager = std::
                _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:227:22)>
                ::_M_manager;
  local_88.body.field_2._M_allocated_capacity =
       (size_type)
       (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_._M_invoker;
  (this->super_BasicAuthIntegrationTest).super_IntegrationTest.fetchPrePerform_._M_invoker =
       std::
       _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc:227:22)>
       ::_M_invoke;
  local_d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  if ((_Manager_type)local_88.body._M_string_length != (_Manager_type)0x0) {
    (*(code *)local_88.body._M_string_length)
              ((_Any_data *)&local_88,(_Any_data *)&local_88,__destroy_functor);
  }
  IntegrationTest::FetchMetrics
            (&local_88,(IntegrationTest *)this,
             &(this->super_BasicAuthIntegrationTest).super_IntegrationTest.default_metrics_path_);
  local_a8[0].data_._0_4_ = 200;
  AVar4 = testing::internal::CmpHelperEQ<long,int>
                    ((internal *)&local_d8,"metrics.code","200",&local_88.code,(int *)local_a8);
  substring._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )AVar4.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  if (local_d8._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if ((undefined8 *)CONCAT44(uStack_cc,uStack_d0) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT44(uStack_cc,uStack_d0);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if (local_a8[0].data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a8[0].data_ + 8))();
    }
    uVar2 = (undefined8 *)CONCAT44(uStack_cc,uStack_d0);
  }
  else {
    puVar1 = (undefined8 *)CONCAT44(uStack_cc,uStack_d0);
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
      substring._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    testing::HasSubstr<std::__cxx11::string>
              (&local_38,(testing *)&(this->super_BasicAuthIntegrationTest).counter_name_,
               (StringLike<std::__cxx11::basic_string<char>_> *)
               substring._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    local_d8._M_head_impl = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,local_38.impl_.substring_._M_dataplus._M_p,
               local_38.impl_.substring_._M_dataplus._M_p +
               local_38.impl_.substring_._M_string_length);
    local_a8[0].data_ = (AssertHelperData *)local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_d8._M_head_impl,
               local_d8._M_head_impl + CONCAT44(uStack_cc,uStack_d0));
    if (local_d8._M_head_impl != local_c8) {
      operator_delete(local_d8._M_head_impl);
    }
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
    ::operator()(&local_b8,(char *)local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1674e8);
    if (local_a8[0].data_ != (AssertHelperData *)local_98) {
      operator_delete(local_a8[0].data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.impl_.substring_._M_dataplus._M_p != &local_38.impl_.substring_.field_2) {
      operator_delete(local_38.impl_.substring_._M_dataplus._M_p);
    }
    uVar2 = local_b8._8_8_;
    if (local_b8._M_pod_data[0] == '\0') {
      testing::Message::Message((Message *)&local_d8);
      if ((undefined8 *)local_b8._8_8_ == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_b8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/pull/tests/integration/integration_test.cc"
                 ,0xeb,pcVar3);
      testing::internal::AssertHelper::operator=(local_a8,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(local_a8);
      uVar2 = local_b8._8_8_;
      if (local_d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
        uVar2 = local_b8._8_8_;
      }
    }
  }
  if ((undefined8 *)uVar2 != (undefined8 *)0x0) {
    if (*(undefined8 **)uVar2 != (undefined8 *)(uVar2 + 0x10)) {
      operator_delete(*(undefined8 **)uVar2);
    }
    operator_delete((void *)uVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.contentType._M_dataplus._M_p != &local_88.contentType.field_2) {
    operator_delete(local_88.contentType._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.body._M_dataplus._M_p != &local_88.body.field_2) {
    operator_delete(local_88.body._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldPerformProperAuthentication) {
  fetchPrePerform_ = [&](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(curl, CURLOPT_USERNAME, username_.c_str());
    curl_easy_setopt(curl, CURLOPT_PASSWORD, password_.c_str());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 200);
  EXPECT_THAT(metrics.body, HasSubstr(counter_name_));
}